

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QColorToolButton.cpp
# Opt level: O1

int __thiscall QColorToolButton::qt_metacall(QColorToolButton *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  QColorToolButton *_t;
  void *local_38;
  void *local_30;
  
  _id_00 = QToolButton::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((-1 < _id_00) && (_c < (BindableProperty|ReadProperty))) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 == 0) {
          local_30 = _a[1];
          local_38 = (void *)0x0;
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) {
          return _id_00;
        }
        if (_id_00 == 0) {
          *(undefined8 *)*_a = 0;
        }
      }
      _id_00 = _id_00 + -1;
    }
    else {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 + -3;
    }
  }
  return _id_00;
}

Assistant:

int QColorToolButton::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QEmbedableButton::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}